

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

bool __thiscall libcellml::Component::removeReset(Component *this,ResetPtr *reset)

{
  shared_ptr<libcellml::Reset> *psVar1;
  const_iterator __position;
  ResetImpl *this_00;
  
  __position = ComponentImpl::findReset
                         ((ComponentImpl *)
                          (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                          super_Entity.mPimpl,reset);
  psVar1 = *(shared_ptr<libcellml::Reset> **)
            ((long)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                    super_Entity.mPimpl[5].mId.field_2 + 8);
  if (__position._M_current != psVar1) {
    this_00 = Reset::pFunc(((__position._M_current)->
                           super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
    std::
    vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
    _M_erase((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
              *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl[5].mId.field_2,(iterator)__position._M_current);
  }
  return __position._M_current != psVar1;
}

Assistant:

bool Component::removeReset(const ResetPtr &reset)
{
    auto result = pFunc()->findReset(reset);
    if (result != pFunc()->mResets.end()) {
        (*result)->pFunc()->removeParent();
        pFunc()->mResets.erase(result);
        return true;
    }
    return false;
}